

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cmdline.c
# Opt level: O0

void test_no_options(void)

{
  int iVar1;
  int ret;
  void *in_stack_00000068;
  _func_int_int_char_ptr_void_ptr *in_stack_00000070;
  char **in_stack_00000078;
  int in_stack_00000084;
  CMDLINE_OPTION *in_stack_00000088;
  
  iVar1 = cmdline_read(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000070,
                       in_stack_00000068);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-cmdline.c"
                 ,0xab,"%s","ret == 0");
  return;
}

Assistant:

static void
test_no_options(void)
{
    static const CMDLINE_OPTION optlist[] = { { 0 } };
    static char* argv[] = { "foo" };
    static const int argc = sizeof(argv) / sizeof(argv[0]);
    int ret;

    ret = cmdline_read(optlist, argc, argv, test_no_options_callback, NULL);
    TEST_CHECK(ret == 0);
}